

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void google::protobuf::internal::MapMergeFrom<int,proto2_unittest::ForeignMessage>
               (Map<int,_proto2_unittest::ForeignMessage> *dest,
               Map<int,_proto2_unittest::ForeignMessage> *src)

{
  bool bVar1;
  reference key;
  ForeignMessage *this;
  value_type *elem;
  const_iterator __end0;
  const_iterator __begin0;
  Map<int,_proto2_unittest::ForeignMessage> *__range3;
  Map<int,_proto2_unittest::ForeignMessage> *src_local;
  Map<int,_proto2_unittest::ForeignMessage> *dest_local;
  
  Map<int,_proto2_unittest::ForeignMessage>::begin
            ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,src);
  Map<int,_proto2_unittest::ForeignMessage>::end((const_iterator *)&elem,src);
  while( true ) {
    bVar1 = protobuf::operator!=
                      ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,
                       (const_iterator *)&elem);
    if (!bVar1) break;
    key = Map<int,_proto2_unittest::ForeignMessage>::const_iterator::operator*
                    ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_);
    this = Map<int,_proto2_unittest::ForeignMessage>::operator[]<int>(dest,&key->first);
    proto2_unittest::ForeignMessage::operator=(this,&key->second);
    Map<int,_proto2_unittest::ForeignMessage>::const_iterator::operator++
              ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void MapMergeFrom(Map<T...>& dest, const Map<T...>& src) {
  for (const auto& elem : src) {
    dest[elem.first] = elem.second;
  }
}